

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_header_encoder.c
# Opt level: O3

lzma_ret lzma_block_header_encode(lzma_block *block,uint8_t *out)

{
  long *plVar1;
  lzma_ret lVar2;
  lzma_ret lVar3;
  uint32_t uVar4;
  lzma_vli lVar5;
  byte bVar6;
  lzma_filter *plVar7;
  long lVar8;
  uint uVar9;
  size_t out_pos;
  size_t local_38;
  ulong out_size;
  
  local_38 = 2;
  lVar5 = lzma_block_unpadded_size(block);
  lVar3 = LZMA_PROG_ERROR;
  if ((lVar5 != 0) && (-2 < (long)block->uncompressed_size)) {
    uVar9 = block->header_size - 4;
    out_size = (ulong)uVar9;
    *out = (uint8_t)(uVar9 >> 2);
    out[1] = '\0';
    if (block->compressed_size != 0xffffffffffffffff) {
      lVar2 = lzma_vli_encode(block->compressed_size,(size_t *)0x0,out,&local_38,out_size);
      if (lVar2 != LZMA_OK) {
        return lVar2;
      }
      out[1] = out[1] | 0x40;
    }
    if (block->uncompressed_size != 0xffffffffffffffff) {
      lVar2 = lzma_vli_encode(block->uncompressed_size,(size_t *)0x0,out,&local_38,out_size);
      if (lVar2 != LZMA_OK) {
        return lVar2;
      }
      out[1] = out[1] | 0x80;
    }
    plVar7 = block->filters;
    if ((plVar7 != (lzma_filter *)0x0) && (plVar7->id != 0xffffffffffffffff)) {
      bVar6 = 0xff;
      lVar8 = 0;
      do {
        if (lVar8 == 0x40) {
          return LZMA_PROG_ERROR;
        }
        lVar3 = lzma_filter_flags_encode
                          ((lzma_filter *)((long)&plVar7->id + lVar8),out,&local_38,out_size);
        if (lVar3 != LZMA_OK) {
          return lVar3;
        }
        plVar7 = block->filters;
        bVar6 = bVar6 + 1;
        plVar1 = (long *)((long)&plVar7[1].id + lVar8);
        lVar8 = lVar8 + 0x10;
      } while (*plVar1 != -1);
      out[1] = out[1] | bVar6;
      lVar3 = LZMA_OK;
      memset(out + local_38,0,out_size - local_38);
      uVar4 = lzma_crc32(out,out_size,0);
      *(uint32_t *)(out + out_size) = uVar4;
    }
  }
  return lVar3;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_block_header_encode(const lzma_block *block, uint8_t *out)
{
	size_t out_size;
	size_t out_pos = 2;
	size_t filter_count = 0;

	// Validate everything but filters.
	if (lzma_block_unpadded_size(block) == 0
			|| !lzma_vli_is_valid(block->uncompressed_size))
		return LZMA_PROG_ERROR;

	// Indicate the size of the buffer _excluding_ the CRC32 field.
	out_size = block->header_size - 4;

	// Store the Block Header Size.
	out[0] = out_size / 4;

	// We write Block Flags in pieces.
	out[1] = 0x00;

	// Compressed Size
	if (block->compressed_size != LZMA_VLI_UNKNOWN) {
		return_if_error(lzma_vli_encode(block->compressed_size, NULL,
				out, &out_pos, out_size));

		out[1] |= 0x40;
	}

	// Uncompressed Size
	if (block->uncompressed_size != LZMA_VLI_UNKNOWN) {
		return_if_error(lzma_vli_encode(block->uncompressed_size, NULL,
				out, &out_pos, out_size));

		out[1] |= 0x80;
	}

	// Filter Flags
	if (block->filters == NULL || block->filters[0].id == LZMA_VLI_UNKNOWN)
		return LZMA_PROG_ERROR;

	do {
		// There can be a maximum of four filters.
		if (filter_count == LZMA_FILTERS_MAX)
			return LZMA_PROG_ERROR;

		return_if_error(lzma_filter_flags_encode(
				block->filters + filter_count,
				out, &out_pos, out_size));

	} while (block->filters[++filter_count].id != LZMA_VLI_UNKNOWN);

	out[1] |= filter_count - 1;

	// Padding
	memzero(out + out_pos, out_size - out_pos);

	// CRC32
	unaligned_write32le(out + out_size, lzma_crc32(out, out_size, 0));

	return LZMA_OK;
}